

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExternalMakefileProjectGenerator.cxx
# Opt level: O3

string * cmExternalMakefileProjectGenerator::CreateFullGeneratorName
                   (string *__return_storage_ptr__,string *globalGenerator,string *extraGenerator)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (globalGenerator->_M_string_length != 0) {
    if (extraGenerator->_M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)(globalGenerator->_M_dataplus)._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmExternalMakefileProjectGenerator::CreateFullGeneratorName(
  const std::string& globalGenerator, const std::string& extraGenerator)
{
  std::string fullName;
  if (!globalGenerator.empty()) {
    if (!extraGenerator.empty()) {
      fullName = extraGenerator;
      fullName += " - ";
    }
    fullName += globalGenerator;
  }
  return fullName;
}